

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void clog::concurrentFunc(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  type str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  paVar1 = &local_70.field_2;
  while (_runing == '\x01') {
    BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::take(&local_70,
           (BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)queue_abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar1) {
      local_50.field_2._8_8_ = local_70.field_2._8_8_;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
    }
    local_50.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
    local_50.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
    local_50._M_string_length = local_70._M_string_length;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::~string((string *)&local_70);
    defaultOutput(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  sVar2 = BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)queue_abi_cxx11_);
  if ((int)sVar2 != 0) {
    uVar4 = 0;
    if (0 < (int)sVar2) {
      uVar4 = sVar2 & 0xffffffff;
    }
    while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
      BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::take(&local_70,
             (BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)queue_abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == paVar1) {
        local_50.field_2._8_8_ = local_70.field_2._8_8_;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
      }
      local_50.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
      local_50.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
      local_50._M_string_length = local_70._M_string_length;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::~string((string *)&local_70);
      defaultOutput(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void concurrentFunc()  // 多线程场景下单独使用一个线程来写日志
{
    while (_runing)
    {
        auto str(std::move(queue.take()));
        defaultOutput(str);
    }

    int size;

    if((size = queue.size()) != 0)
    {
        for (int i=0; i<size; ++i)
        {
            auto str(std::move(queue.take()));
            defaultOutput(str);
        }
    }
}